

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O2

void Helpers::WriteOutputPNG
               (string *path,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,uint width,
               uint bufferHeight,double gamma,double colorScale)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  uint uVar3;
  pointer puVar4;
  FILE *pFVar5;
  png_structp ppVar6;
  __jmp_buf_tag *__env;
  ostream *poVar7;
  ulong uVar8;
  pointer puVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint j;
  ulong __n;
  double dVar13;
  png_structp png_ptr;
  png_infop info_ptr;
  ScopedCFileDescriptor fd;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rows;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pngData;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pngData,(ulong)(width * bufferHeight * 6),(allocator_type *)&rows);
  __n = (ulong)(bufferHeight * 2);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            (&rows,__n,(allocator_type *)&fd);
  uVar3 = 0;
  for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
    rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] =
         pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + uVar3;
    uVar3 = uVar3 + width * 3;
  }
  puVar9 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = 0;
  uVar8 = 1;
  while( true ) {
    if ((ulong)((long)puVar4 - (long)puVar9 >> 2) <= (ulong)uVar3) break;
    uVar10 = (ulong)puVar9[uVar3];
    if (puVar9[uVar3] < (uint)uVar8) {
      uVar10 = uVar8;
    }
    uVar8 = uVar10;
    uVar3 = uVar3 + 1;
  }
  auVar1._8_8_ = -(ulong)(0.0001 < ABS(gamma + -1.0));
  auVar1._0_8_ = -(ulong)(0.0001 < ABS(colorScale + -1.0));
  iVar11 = movmskpd((uint)uVar8,auVar1);
  uVar3 = 0;
  while( true ) {
    uVar12 = (ulong)uVar3;
    uVar10 = (long)puVar4 - (long)puVar9 >> 2;
    if (uVar10 <= uVar12) break;
    if (iVar11 == 0) {
      uVar2 = (uchar)((puVar9[uVar12] * 0xff + (int)(uVar8 >> 1)) / uVar8);
    }
    else {
      dVar13 = ((double)puVar9[uVar12] * colorScale) / (double)uVar8;
      if (1.0 <= dVar13) {
        dVar13 = 1.0;
      }
      dVar13 = pow(dVar13,gamma);
      uVar2 = (uchar)(int)(dVar13 * 255.0);
      uVar10 = (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 2;
    }
    pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12 + uVar10] = uVar2;
    uVar3 = uVar3 + 1;
    puVar9 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (uVar8 = 0; uVar8 != bufferHeight; uVar8 = uVar8 + 1) {
    for (uVar10 = 0; width * 3 != uVar10; uVar10 = uVar10 + 1) {
      rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8][uVar10] =
           rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[~(uint)uVar8 + bufferHeight * 2][uVar10];
    }
  }
  pFVar5 = fopen((path->_M_dataplus)._M_p,"wb");
  fd.Descriptor = (FILE *)pFVar5;
  if (pFVar5 == (FILE *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to open image.png for writing.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    ppVar6 = (png_structp)png_create_write_struct("1.6.37",0,0);
    png_ptr = ppVar6;
    if (ppVar6 != (png_structp)0x0) {
      info_ptr = (png_infop)png_create_info_struct(ppVar6);
      if (info_ptr == (png_infop)0x0) {
        png_destroy_write_struct(&png_ptr,0);
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar6,longjmp,200);
        iVar11 = _setjmp(__env);
        if (iVar11 == 0) {
          png_init_io(png_ptr,pFVar5);
          png_set_IHDR(png_ptr,info_ptr,width,__n,8,2,0,0,0);
          png_write_info(png_ptr,info_ptr);
          png_write_image(png_ptr,rows.
                                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          png_write_end(png_ptr,info_ptr);
        }
        png_destroy_write_struct(&png_ptr,&info_ptr);
      }
    }
  }
  ScopedCFileDescriptor::~ScopedCFileDescriptor(&fd);
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
            (&rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void WriteOutputPNG(const std::string &path, const std::vector<uint32_t>& data, unsigned int width, unsigned int bufferHeight, double gamma, double colorScale)
    {
        std::vector<png_byte> pngData(3*width*2*bufferHeight);
        std::vector<png_byte *> rows{2*bufferHeight};
        for(unsigned int i = 0; i < 2*bufferHeight ; ++i)
        {
            rows[i] = pngData.data()+3*width*i;
        }

        uint32_t maxValue{UINT32_C(1)};
        for(unsigned int i = 0; i < data.size();++i)
        {
            maxValue = std::max(maxValue,data[i]);
        }
        for(unsigned int i = 0; i < data.size();++i)
        {
            if(fabs(gamma - 1.0) > 0.0001 || fabs(colorScale - 1.0) > 0.0001)
            {
                pngData[data.size() + i] = static_cast<png_byte>(255.0 * pow(std::min(1.0,colorScale*static_cast<double>(data[i])/static_cast<double>(maxValue)),gamma));
            }
            else
            {
                pngData[data.size() + i] = (255*data[i] + (maxValue/2))/maxValue;
            }
        }
        for(unsigned int i = 0; i < bufferHeight;++i)
        {
            for(unsigned int j = 0; j < width*3;++j)
            {
                rows[i][j] =rows[2*bufferHeight-i-1][j];
            }
        }

        ScopedCFileDescriptor fd(path.c_str(), "wb");
        if(!fd.IsValid())
        {
            std::cerr << "Failed to open image.png for writing." << std::endl;
            return;
        }
        png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
        if(!png_ptr)
        {
            return;
        }
        png_infop info_ptr = png_create_info_struct(png_ptr);
        if(!info_ptr)
        {
            png_destroy_write_struct(&png_ptr, (png_infopp)NULL);
            return;
        }
        if(setjmp(png_jmpbuf(png_ptr)))
        {
            png_destroy_write_struct(&png_ptr, &info_ptr);
            return;
        }
        png_init_io(png_ptr, fd.Get());
        png_set_IHDR(png_ptr, info_ptr, width, 2*bufferHeight, 8, PNG_COLOR_TYPE_RGB, PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

        png_write_info(png_ptr, info_ptr);
        //header written.

        png_write_image(png_ptr, rows.data());

        png_write_end(png_ptr, info_ptr);
        png_destroy_write_struct(&png_ptr, &info_ptr);
    }